

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_ffi_tapi.cpp
# Opt level: O3

void init_ctrade_array(vector<Trade,_std::allocator<Trade>_> *c,
                      vector<tquant::api::Trade,_std::allocator<tquant::api::Trade>_> *trades)

{
  pointer pTVar1;
  int32_t *piVar2;
  long lVar3;
  int32_t *piVar4;
  
  std::vector<Trade,_std::allocator<Trade>_>::resize
            (c,((long)(trades->
                      super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(trades->
                      super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
                      _M_impl.super__Vector_impl_data._M_start >> 5) * 0x6db6db6db6db6db7);
  pTVar1 = (trades->super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(trades->super__Vector_base<tquant::api::Trade,_std::allocator<tquant::api::Trade>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1;
  if (lVar3 != 0) {
    lVar3 = (lVar3 >> 5) * 0x6db6db6db6db6db7;
    lVar3 = lVar3 + (ulong)(lVar3 == 0);
    piVar4 = &((c->super__Vector_base<Trade,_std::allocator<Trade>_>)._M_impl.
               super__Vector_impl_data._M_start)->order_id;
    piVar2 = &pTVar1->order_id;
    do {
      ((Trade *)(piVar4 + -0x12))->account_id =
           (((Trade *)(piVar2 + -0x36))->account_id)._M_dataplus._M_p;
      *(pointer *)(piVar4 + -0x10) = (((string *)(piVar2 + -0x2e))->_M_dataplus)._M_p;
      *(pointer *)(piVar4 + -0xe) = (((string *)(piVar2 + -0x26))->_M_dataplus)._M_p;
      *(pointer *)(piVar4 + -0xc) = (((string *)(piVar2 + -0x1e))->_M_dataplus)._M_p;
      *(pointer *)(piVar4 + -10) = (((string *)(piVar2 + -0x16))->_M_dataplus)._M_p;
      *(pointer *)(piVar4 + -8) = (((string *)(piVar2 + -0xe))->_M_dataplus)._M_p;
      *(int64_t *)(piVar4 + -6) = *(int64_t *)(piVar2 + -6);
      *(double *)(piVar4 + -4) = *(double *)(piVar2 + -4);
      *(undefined8 *)(piVar4 + -2) = *(undefined8 *)(piVar2 + -2);
      *piVar4 = *piVar2;
      piVar4 = piVar4 + 0x13;
      piVar2 = piVar2 + 0x38;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void init_ctrade_array(vector<Trade>* c, const vector<tquant::api::Trade>* trades)
{
    c->resize(trades->size());
    for (size_t i =0; i < trades->size(); i++) {
        auto p1 = &(*c)[i];
        auto p2 = &(*trades)[i];
        init_ctrade(p1, p2);
    }
}